

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableEndCell(ImGuiTable *table)

{
  float fVar1;
  int iVar2;
  ImGuiWindow *pIVar3;
  ImGuiTableColumn *pIVar4;
  long lVar5;
  uint uVar6;
  float fVar7;
  
  iVar2 = table->CurrentColumn;
  pIVar3 = table->InnerWindow;
  pIVar4 = (table->Columns).Data;
  if ((pIVar3->DC).IsSetPos == true) {
    ErrorCheckUsingSetCursorPosToExtendParentBoundaries();
  }
  if ((table->field_0x94 & 1) == 0) {
    lVar5 = (ulong)table->IsUnfrozenRows * 4 + 0x40;
  }
  else {
    lVar5 = 0x48;
  }
  fVar7 = *(float *)((long)&pIVar4[iVar2].Flags + lVar5);
  fVar1 = (pIVar3->DC).CursorMaxPos.x;
  uVar6 = -(uint)(fVar1 <= fVar7);
  *(uint *)((long)&pIVar4[iVar2].Flags + lVar5) = ~uVar6 & (uint)fVar1 | (uint)fVar7 & uVar6;
  if (pIVar4[iVar2].IsEnabled == true) {
    fVar7 = (pIVar3->DC).CursorMaxPos.y + table->RowCellPaddingY;
    uVar6 = -(uint)(fVar7 <= table->RowPosY2);
    table->RowPosY2 = (float)(uVar6 & (uint)table->RowPosY2 | ~uVar6 & (uint)fVar7);
  }
  pIVar4[iVar2].ItemWidth = (pIVar3->DC).ItemWidth;
  fVar7 = (pIVar3->DC).PrevLineTextBaseOffset;
  uVar6 = -(uint)(fVar7 <= table->RowTextBaseline);
  table->RowTextBaseline = (float)(~uVar6 & (uint)fVar7 | (uint)table->RowTextBaseline & uVar6);
  return;
}

Assistant:

void ImGui::TableEndCell(ImGuiTable* table)
{
    ImGuiTableColumn* column = &table->Columns[table->CurrentColumn];
    ImGuiWindow* window = table->InnerWindow;

    if (window->DC.IsSetPos)
        ErrorCheckUsingSetCursorPosToExtendParentBoundaries();

    // Report maximum position so we can infer content size per column.
    float* p_max_pos_x;
    if (table->RowFlags & ImGuiTableRowFlags_Headers)
        p_max_pos_x = &column->ContentMaxXHeadersUsed;  // Useful in case user submit contents in header row that is not a TableHeader() call
    else
        p_max_pos_x = table->IsUnfrozenRows ? &column->ContentMaxXUnfrozen : &column->ContentMaxXFrozen;
    *p_max_pos_x = ImMax(*p_max_pos_x, window->DC.CursorMaxPos.x);
    if (column->IsEnabled)
        table->RowPosY2 = ImMax(table->RowPosY2, window->DC.CursorMaxPos.y + table->RowCellPaddingY);
    column->ItemWidth = window->DC.ItemWidth;

    // Propagate text baseline for the entire row
    // FIXME-TABLE: Here we propagate text baseline from the last line of the cell.. instead of the first one.
    table->RowTextBaseline = ImMax(table->RowTextBaseline, window->DC.PrevLineTextBaseOffset);
}